

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

void __thiscall Mat::addFrom_pos(Mat *this,char **p)

{
  pointer p_Var1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  Constant::Util::char_to_int(p);
  Constant::Util::char_to_int(p);
  uVar7 = this->c * this->r;
  uVar6 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar6;
  }
  for (; uVar8 * 0x10 != uVar6; uVar6 = uVar6 + 0x10) {
    uVar3 = Constant::Util::char_to_ll(p);
    p_Var1 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = uVar3 + *(ulong *)((long)p_Var1 + uVar6);
    lVar5 = ((long)uVar3 >> 0x3f) + *(long *)((long)p_Var1 + uVar6 + 8) +
            (ulong)CARRY8(uVar3,*(ulong *)((long)p_Var1 + uVar6));
    uVar3 = uVar4 + 0x16345785d8a0003;
    lVar2 = lVar5 + (ulong)(0xfe9cba87a275fffc < uVar4);
    if ((SBORROW8(lVar5,-1) != SBORROW8(lVar5 + 1,(ulong)(uVar4 < 0xfe9cba87a275fffe))) ==
        (long)((lVar5 + 1) - (ulong)(uVar4 < 0xfe9cba87a275fffe)) < 0) {
      uVar3 = uVar4;
      lVar2 = lVar5;
    }
    if (-lVar5 < (long)(ulong)(0x16345785d8a0002 < uVar4)) {
      uVar3 = uVar4 + 0xfe9cba87a275fffd;
      lVar2 = lVar5 + -1 + (ulong)(0x16345785d8a0002 < uVar4);
    }
    *(ulong *)((long)p_Var1 + uVar6) = uVar3;
    *(long *)((long)p_Var1 + uVar6 + 8) = lVar2;
  }
  return;
}

Assistant:

void Mat::addFrom_pos(char *&p) {
    int tmp_r, tmp_c;
    tmp_r = Constant::Util::char_to_int(p);
    tmp_c = Constant::Util::char_to_int(p);
    int l = r * c;
//    cout << "l: " << l << endl;
    for (int i = 0; i < l; i++) {
        val[i] += Constant::Util::char_to_ll(p);
        val[i] = val[i] >= MOD ? val[i] - MOD : val[i];
        val[i] = val[i] <= -MOD ? val[i] + MOD : val[i];
    }
}